

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_info.cc
# Opt level: O0

parse_result_t parse_key(X509_INFO *info,uint8_t *data,size_t len,int key_type)

{
  X509_PKEY *pXVar1;
  EVP_PKEY *pEVar2;
  int key_type_local;
  size_t len_local;
  uint8_t *data_local;
  X509_INFO *info_local;
  
  if (info->x_pkey == (X509_PKEY *)0x0) {
    len_local = (size_t)data;
    data_local = (uint8_t *)info;
    pXVar1 = X509_PKEY_new();
    *(X509_PKEY **)(data_local + 0x10) = pXVar1;
    if (*(long *)(data_local + 0x10) == 0) {
      info_local._4_4_ = parse_error;
    }
    else {
      pEVar2 = d2i_PrivateKey(key_type,(EVP_PKEY **)0x0,(uchar **)&len_local,len);
      **(undefined8 **)(data_local + 0x10) = pEVar2;
      info_local._4_4_ = (parse_result_t)(**(long **)(data_local + 0x10) == 0);
    }
  }
  else {
    info_local._4_4_ = parse_new_entry;
  }
  return info_local._4_4_;
}

Assistant:

static enum parse_result_t parse_key(X509_INFO *info, const uint8_t *data,
                                     size_t len, int key_type) {
  if (info->x_pkey != NULL) {
    return parse_new_entry;
  }
  info->x_pkey = X509_PKEY_new();
  if (info->x_pkey == NULL) {
    return parse_error;
  }
  info->x_pkey->dec_pkey = d2i_PrivateKey(key_type, NULL, &data, len);
  return info->x_pkey->dec_pkey != NULL ? parse_ok : parse_error;
}